

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O2

VkFormat ktxTexture1_GetVkFormat(ktxTexture1 *This)

{
  ktx_uint32_t kVar1;
  ktx_uint32_t kVar2;
  VkFormat VVar3;
  VkFormat VVar4;
  
  kVar1 = This->glInternalformat;
  VVar3 = VK_FORMAT_R8_UNORM;
  switch(kVar1) {
  case 0x93b0:
    VVar3 = VK_FORMAT_ASTC_4x4_UNORM_BLOCK;
    break;
  case 0x93b1:
    VVar3 = VK_FORMAT_ASTC_5x4_UNORM_BLOCK;
    break;
  case 0x93b2:
    VVar3 = VK_FORMAT_ASTC_5x5_UNORM_BLOCK;
    break;
  case 0x93b3:
    VVar3 = VK_FORMAT_ASTC_6x5_UNORM_BLOCK;
    break;
  case 0x93b4:
    VVar3 = VK_FORMAT_ASTC_6x6_UNORM_BLOCK;
    break;
  case 0x93b5:
    VVar3 = VK_FORMAT_ASTC_8x5_UNORM_BLOCK;
    break;
  case 0x93b6:
    VVar3 = VK_FORMAT_ASTC_8x6_UNORM_BLOCK;
    break;
  case 0x93b7:
    VVar3 = VK_FORMAT_ASTC_8x8_UNORM_BLOCK;
    break;
  case 0x93b8:
    VVar3 = VK_FORMAT_ASTC_10x5_UNORM_BLOCK;
    break;
  case 0x93b9:
    VVar3 = VK_FORMAT_ASTC_10x6_UNORM_BLOCK;
    break;
  case 0x93ba:
    VVar3 = VK_FORMAT_ASTC_10x8_UNORM_BLOCK;
    break;
  case 0x93bb:
    VVar3 = VK_FORMAT_ASTC_10x10_UNORM_BLOCK;
    break;
  case 0x93bc:
    VVar3 = VK_FORMAT_ASTC_12x10_UNORM_BLOCK;
    break;
  case 0x93bd:
    VVar3 = VK_FORMAT_ASTC_12x12_UNORM_BLOCK;
    break;
  case 0x93be:
  case 0x93bf:
  case 0x93c0:
  case 0x93c1:
  case 0x93c2:
  case 0x93c3:
  case 0x93c4:
  case 0x93c5:
  case 0x93c6:
  case 0x93c7:
  case 0x93c8:
  case 0x93c9:
  case 0x93ca:
  case 0x93cb:
  case 0x93cc:
  case 0x93cd:
  case 0x93ce:
  case 0x93cf:
  case 0x93de:
  case 0x93df:
  case 0x93e0:
  case 0x93e1:
  case 0x93e2:
  case 0x93e3:
  case 0x93e4:
  case 0x93e5:
  case 0x93e6:
  case 0x93e7:
  case 0x93e8:
  case 0x93e9:
  case 0x93ea:
  case 0x93eb:
  case 0x93ec:
  case 0x93ed:
  case 0x93ee:
  case 0x93ef:
    goto switchD_001fda9e_caseD_8d8a;
  case 0x93d0:
    VVar3 = VK_FORMAT_ASTC_4x4_SRGB_BLOCK;
    break;
  case 0x93d1:
    VVar3 = VK_FORMAT_ASTC_5x4_SRGB_BLOCK;
    break;
  case 0x93d2:
    VVar3 = VK_FORMAT_ASTC_5x5_SRGB_BLOCK;
    break;
  case 0x93d3:
    VVar3 = VK_FORMAT_ASTC_6x5_SRGB_BLOCK;
    break;
  case 0x93d4:
    VVar3 = VK_FORMAT_ASTC_6x6_SRGB_BLOCK;
    break;
  case 0x93d5:
    VVar3 = VK_FORMAT_ASTC_8x5_SRGB_BLOCK;
    break;
  case 0x93d6:
    VVar3 = VK_FORMAT_ASTC_8x6_SRGB_BLOCK;
    break;
  case 0x93d7:
    VVar3 = VK_FORMAT_ASTC_8x8_SRGB_BLOCK;
    break;
  case 0x93d8:
    VVar3 = VK_FORMAT_ASTC_10x5_SRGB_BLOCK;
    break;
  case 0x93d9:
    VVar3 = VK_FORMAT_ASTC_10x6_SRGB_BLOCK;
    break;
  case 0x93da:
    VVar3 = VK_FORMAT_ASTC_10x8_SRGB_BLOCK;
    break;
  case 0x93db:
    VVar3 = VK_FORMAT_ASTC_10x10_SRGB_BLOCK;
    break;
  case 0x93dc:
    VVar3 = VK_FORMAT_ASTC_12x10_SRGB_BLOCK;
    break;
  case 0x93dd:
    VVar3 = VK_FORMAT_ASTC_12x12_SRGB_BLOCK;
    break;
  case 0x93f0:
    VVar3 = VK_FORMAT_PVRTC2_2BPP_SRGB_BLOCK_IMG;
    break;
  case 0x93f1:
    VVar3 = VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG;
    break;
  default:
    switch(kVar1) {
    case 0x8229:
      break;
    case 0x822a:
      VVar3 = VK_FORMAT_R16_UNORM;
      break;
    case 0x822b:
      VVar3 = VK_FORMAT_R8G8_UNORM;
      break;
    case 0x822c:
      VVar3 = VK_FORMAT_R16G16_UNORM;
      break;
    case 0x822d:
      VVar3 = VK_FORMAT_R16_SFLOAT;
      break;
    case 0x822e:
      VVar3 = VK_FORMAT_R32_SFLOAT;
      break;
    case 0x822f:
      VVar3 = VK_FORMAT_R16G16_SFLOAT;
      break;
    case 0x8230:
      VVar3 = VK_FORMAT_R32G32_SFLOAT;
      break;
    case 0x8231:
      VVar3 = VK_FORMAT_R8_SINT;
      break;
    case 0x8232:
      VVar3 = VK_FORMAT_R8_UINT;
      break;
    case 0x8233:
      VVar3 = VK_FORMAT_R16_SINT;
      break;
    case 0x8234:
      VVar3 = VK_FORMAT_R16_UINT;
      break;
    case 0x8235:
      VVar3 = VK_FORMAT_R32_SINT;
      break;
    case 0x8236:
      VVar3 = VK_FORMAT_R32_UINT;
      break;
    case 0x8237:
      VVar3 = VK_FORMAT_R8G8_SINT;
      break;
    case 0x8238:
      VVar3 = VK_FORMAT_R8G8_UINT;
      break;
    case 0x8239:
      VVar3 = VK_FORMAT_R16G16_SINT;
      break;
    case 0x823a:
      VVar3 = VK_FORMAT_R16G16_UINT;
      break;
    case 0x823b:
      VVar3 = VK_FORMAT_R32G32_SINT;
      break;
    case 0x823c:
      VVar3 = VK_FORMAT_R32G32_UINT;
      break;
    default:
      switch(kVar1) {
      case 0x9270:
        VVar3 = VK_FORMAT_EAC_R11_UNORM_BLOCK;
        break;
      case 0x9271:
        VVar3 = VK_FORMAT_EAC_R11_SNORM_BLOCK;
        break;
      case 0x9272:
        VVar3 = VK_FORMAT_EAC_R11G11_UNORM_BLOCK;
        break;
      case 0x9273:
        VVar3 = VK_FORMAT_EAC_R11G11_SNORM_BLOCK;
        break;
      case 0x9274:
switchD_001fda11_caseD_9274:
        VVar3 = VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
        break;
      case 0x9275:
        VVar3 = VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK;
        break;
      case 0x9276:
        VVar3 = VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK;
        break;
      case 0x9277:
        VVar3 = VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK;
        break;
      case 0x9278:
        VVar3 = VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
        break;
      case 0x9279:
        VVar3 = VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK;
        break;
      default:
        switch(kVar1) {
        case 0x8050:
          VVar3 = VK_FORMAT_R5G5B5A1_UNORM_PACK16;
          break;
        case 0x8051:
          VVar3 = VK_FORMAT_R8G8B8_UNORM;
          break;
        case 0x8052:
        case 0x8059:
          VVar3 = VK_FORMAT_A2R10G10B10_UNORM_PACK32;
          break;
        case 0x8053:
        case 0x8055:
        case 0x805a:
          goto switchD_001fda9e_caseD_8d8a;
        case 0x8054:
          VVar3 = VK_FORMAT_R16G16B16_UNORM;
          break;
        case 0x8056:
          VVar3 = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
          break;
        case 0x8057:
          VVar3 = VK_FORMAT_A1R5G5B5_UNORM_PACK16;
          break;
        case 0x8058:
          VVar3 = VK_FORMAT_R8G8B8A8_UNORM;
          break;
        case 0x805b:
          VVar3 = VK_FORMAT_R16G16B16A16_UNORM;
          break;
        default:
          switch(kVar1) {
          case 0x8d70:
            VVar3 = VK_FORMAT_R32G32B32A32_UINT;
            break;
          case 0x8d71:
            VVar3 = VK_FORMAT_R32G32B32_UINT;
            break;
          case 0x8d72:
          case 0x8d73:
          case 0x8d74:
          case 0x8d75:
          case 0x8d78:
          case 0x8d79:
          case 0x8d7a:
          case 0x8d7b:
          case 0x8d7e:
          case 0x8d7f:
          case 0x8d80:
          case 0x8d81:
            goto switchD_001fda9e_caseD_8d8a;
          case 0x8d76:
            VVar3 = VK_FORMAT_R16G16B16A16_UINT;
            break;
          case 0x8d77:
            VVar3 = VK_FORMAT_R16G16B16_UINT;
            break;
          case 0x8d7c:
            VVar3 = VK_FORMAT_R8G8B8A8_UINT;
            break;
          case 0x8d7d:
            VVar3 = VK_FORMAT_R8G8B8_UINT;
            break;
          case 0x8d82:
            VVar3 = VK_FORMAT_R32G32B32A32_SINT;
            break;
          case 0x8d83:
            VVar3 = VK_FORMAT_R32G32B32_SINT;
            break;
          default:
            switch(kVar1) {
            case 0x8f94:
              return VK_FORMAT_R8_SNORM;
            case 0x8f95:
              return VK_FORMAT_R8G8_SNORM;
            case 0x8f96:
              return VK_FORMAT_R8G8B8_SNORM;
            case 0x8f97:
              return VK_FORMAT_R8G8B8A8_SNORM;
            case 0x8f98:
              return VK_FORMAT_R16_SNORM;
            case 0x8f99:
              return VK_FORMAT_R16G16_SNORM;
            case 0x8f9a:
              return VK_FORMAT_R16G16B16_SNORM;
            case 0x8f9b:
              return VK_FORMAT_R16G16B16A16_SNORM;
            }
            switch(kVar1) {
            case 0x83f0:
              return VK_FORMAT_BC1_RGB_UNORM_BLOCK;
            case 0x83f1:
              return VK_FORMAT_BC1_RGBA_UNORM_BLOCK;
            case 0x83f2:
              return VK_FORMAT_BC2_UNORM_BLOCK;
            case 0x83f3:
              return VK_FORMAT_BC3_UNORM_BLOCK;
            }
            switch(kVar1) {
            case 0x8814:
              return VK_FORMAT_R32G32B32A32_SFLOAT;
            case 0x8815:
              return VK_FORMAT_R32G32B32_SFLOAT;
            case 0x8816:
            case 0x8817:
            case 0x8818:
            case 0x8819:
              break;
            case 0x881a:
              return VK_FORMAT_R16G16B16A16_SFLOAT;
            case 0x881b:
              return VK_FORMAT_R16G16B16_SFLOAT;
            default:
              switch(kVar1) {
              case 0x8a54:
              case 0x8a56:
                return VK_FORMAT_PVRTC1_2BPP_SRGB_BLOCK_IMG;
              case 0x8a55:
              case 0x8a57:
                return VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG;
              }
              switch(kVar1) {
              case 0x8c00:
              case 0x8c02:
                return VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG;
              case 0x8c01:
              case 0x8c03:
                return VK_FORMAT_PVRTC1_2BPP_UNORM_BLOCK_IMG;
              }
              switch(kVar1) {
              case 0x8c3a:
                return VK_FORMAT_B10G11R11_UFLOAT_PACK32;
              case 0x8c3b:
              case 0x8c3c:
              case 0x8c3e:
              case 0x8c3f:
              case 0x8c40:
              case 0x8c42:
                break;
              case 0x8c3d:
                return VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
              case 0x8c41:
                return VK_FORMAT_R8G8B8_SRGB;
              case 0x8c43:
                return VK_FORMAT_R8G8B8A8_SRGB;
              default:
                switch(kVar1) {
                case 0x8c4c:
                  return VK_FORMAT_BC1_RGB_SRGB_BLOCK;
                case 0x8c4d:
                  return VK_FORMAT_BC1_RGBA_SRGB_BLOCK;
                case 0x8c4e:
                  return VK_FORMAT_BC2_SRGB_BLOCK;
                case 0x8c4f:
                  return VK_FORMAT_BC3_SRGB_BLOCK;
                }
                switch(kVar1) {
                case 0x8c70:
switchD_001fd9fa_caseD_8229:
                  return VK_FORMAT_BC4_UNORM_BLOCK;
                case 0x8c71:
switchD_001fd9fa_caseD_8229:
                  return VK_FORMAT_BC4_SNORM_BLOCK;
                case 0x8c72:
switchD_001fd9fa_caseD_8229:
                  return VK_FORMAT_BC5_UNORM_BLOCK;
                case 0x8c73:
switchD_001fd9fa_caseD_8229:
                  return VK_FORMAT_BC5_SNORM_BLOCK;
                }
                switch(kVar1) {
                case 0x8d88:
                  return VK_FORMAT_R16G16B16A16_SINT;
                case 0x8d89:
                  return VK_FORMAT_R16G16B16_SINT;
                case 0x8d8a:
                case 0x8d8b:
                case 0x8d8c:
                case 0x8d8d:
                  break;
                case 0x8d8e:
                  return VK_FORMAT_R8G8B8A8_SINT;
                case 0x8d8f:
                  return VK_FORMAT_R8G8B8_SINT;
                default:
                  switch(kVar1) {
                  case 0x8dbb:
                    goto switchD_001fd9fa_caseD_8229;
                  case 0x8dbc:
                    goto switchD_001fd9fa_caseD_8229;
                  case 0x8dbd:
                    goto switchD_001fd9fa_caseD_8229;
                  case 0x8dbe:
                    goto switchD_001fd9fa_caseD_8229;
                  }
                  switch(kVar1) {
                  case 0x8e8c:
                    return VK_FORMAT_BC7_UNORM_BLOCK;
                  case 0x8e8d:
                    return VK_FORMAT_BC7_SRGB_BLOCK;
                  case 0x8e8e:
                    return VK_FORMAT_BC6H_SFLOAT_BLOCK;
                  case 0x8e8f:
                    return VK_FORMAT_BC6H_UFLOAT_BLOCK;
                  }
                  if (kVar1 == 0x81a5) {
                    return VK_FORMAT_D16_UNORM;
                  }
                  if (kVar1 == 0x81a6) {
                    return VK_FORMAT_X8_D24_UNORM_PACK32;
                  }
                  if (kVar1 == 0x88f0) {
                    return VK_FORMAT_D24_UNORM_S8_UINT;
                  }
                  if (kVar1 == 0x8cac) {
                    return VK_FORMAT_D32_SFLOAT;
                  }
                  if (kVar1 == 0x8cad) {
                    return VK_FORMAT_D32_SFLOAT_S8_UINT;
                  }
                  if (kVar1 == 0x8d48) {
                    return VK_FORMAT_S8_UINT;
                  }
                  if (kVar1 == 0x8d62) {
                    return VK_FORMAT_R5G6B5_UNORM_PACK16;
                  }
                  if (kVar1 == 0x8d64) goto switchD_001fda11_caseD_9274;
                  if (kVar1 == 0x8dab) {
                    return VK_FORMAT_D32_SFLOAT;
                  }
                  if (kVar1 == 0x8dac) {
                    return VK_FORMAT_D32_SFLOAT_S8_UINT;
                  }
                  if (kVar1 == 0x8fbd) {
                    return VK_FORMAT_R8_SRGB;
                  }
                  if (kVar1 == 0x8fbe) {
                    return VK_FORMAT_R8G8_SRGB;
                  }
                  if (kVar1 == 0x906f) {
                    return VK_FORMAT_A2R10G10B10_UINT_PACK32;
                  }
                  if (kVar1 == 0x9137) {
                    return VK_FORMAT_PVRTC2_2BPP_UNORM_BLOCK_IMG;
                  }
                  if (kVar1 == 0x9138) {
                    return VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG;
                  }
                }
              }
            }
switchD_001fda9e_caseD_8d8a:
            kVar1 = This->glFormat;
            kVar2 = This->glType;
            switch(kVar2) {
            case 0x1400:
              switch(kVar1) {
              case 0x1901:
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                return VK_FORMAT_R8_SNORM;
              case 0x1907:
                return VK_FORMAT_R8G8B8_SNORM;
              case 0x1908:
                return VK_FORMAT_R8G8B8A8_SNORM;
              default:
                switch(kVar1) {
                case 0x8d94:
                  return VK_FORMAT_R8_SINT;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                  break;
                case 0x8d98:
                  return VK_FORMAT_R8G8B8_SINT;
                case 0x8d99:
                  return VK_FORMAT_R8G8B8A8_SINT;
                case 0x8d9a:
                  return VK_FORMAT_B8G8R8_SINT;
                case 0x8d9b:
                  return VK_FORMAT_B8G8R8A8_SINT;
                default:
                  if (kVar1 == 0x80e0) {
                    return VK_FORMAT_B8G8R8_SNORM;
                  }
                  if (kVar1 == 0x80e1) {
                    return VK_FORMAT_B8G8R8A8_SNORM;
                  }
                  if (kVar1 != 0x84f9) {
                    if (kVar1 == 0x8228) {
                      return VK_FORMAT_R8G8_SINT;
                    }
                    if (kVar1 == 0x8227) {
                      return VK_FORMAT_R8G8_SNORM;
                    }
                  }
                }
              }
              break;
            case 0x1401:
              switch(kVar1) {
              case 0x1901:
                return VK_FORMAT_S8_UINT;
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                return VK_FORMAT_R8_UNORM;
              case 0x1907:
                return VK_FORMAT_R8G8B8_UNORM;
              case 0x1908:
                return VK_FORMAT_R8G8B8A8_UNORM;
              default:
                switch(kVar1) {
                case 0x8d94:
                  return VK_FORMAT_R8_UINT;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                  break;
                case 0x8d98:
                  return VK_FORMAT_R8G8B8_UINT;
                case 0x8d99:
                  return VK_FORMAT_R8G8B8A8_UINT;
                case 0x8d9a:
                  return VK_FORMAT_B8G8R8_UINT;
                case 0x8d9b:
                  return VK_FORMAT_B8G8R8A8_UINT;
                default:
                  if (kVar1 == 0x80e0) {
                    return VK_FORMAT_B8G8R8_UNORM;
                  }
                  if (kVar1 == 0x80e1) {
                    return VK_FORMAT_B8G8R8A8_UNORM;
                  }
                  if (kVar1 != 0x84f9) {
                    if (kVar1 == 0x8228) {
                      return VK_FORMAT_R8G8_UINT;
                    }
                    if (kVar1 == 0x8227) {
                      return VK_FORMAT_R8G8_UNORM;
                    }
                  }
                }
              }
              break;
            case 0x1402:
              switch(kVar1) {
              case 0x1901:
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                return VK_FORMAT_R16_SNORM;
              case 0x1907:
                return VK_FORMAT_R16G16B16_SNORM;
              case 0x1908:
                return VK_FORMAT_R16G16B16A16_SNORM;
              default:
                switch(kVar1) {
                case 0x8d94:
                  return VK_FORMAT_R16_SINT;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                case 0x8d98:
                  return VK_FORMAT_R16G16B16_SINT;
                case 0x8d99:
                  return VK_FORMAT_R16G16B16A16_SINT;
                default:
                  if (((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) && (kVar1 != 0x84f9)) {
                    if (kVar1 == 0x8228) {
                      return VK_FORMAT_R16G16_SINT;
                    }
                    if (kVar1 == 0x8227) {
                      return VK_FORMAT_R16G16_SNORM;
                    }
                  }
                }
              }
              break;
            case 0x1403:
              switch(kVar1) {
              case 0x1901:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1902:
                return VK_FORMAT_D16_UNORM;
              case 0x1903:
                return VK_FORMAT_R16_UNORM;
              case 0x1907:
                return VK_FORMAT_R16G16B16_UNORM;
              case 0x1908:
                return VK_FORMAT_R16G16B16A16_UNORM;
              default:
                switch(kVar1) {
                case 0x8d94:
                  return VK_FORMAT_R16_UINT;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                case 0x8d98:
                  return VK_FORMAT_R16G16B16_UINT;
                case 0x8d99:
                  return VK_FORMAT_R16G16B16A16_UINT;
                default:
                  if ((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) {
                    if (kVar1 == 0x84f9) {
                      return VK_FORMAT_D16_UNORM_S8_UINT;
                    }
                    if (kVar1 == 0x8228) {
                      return VK_FORMAT_R16G16_UINT;
                    }
                    if (kVar1 == 0x8227) {
                      return VK_FORMAT_R16G16_UNORM;
                    }
                  }
                }
              }
              break;
            case 0x1404:
              VVar3 = VK_FORMAT_R32_SINT;
              switch(kVar1) {
              case 0x1901:
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                goto switchD_001fd9fa_caseD_8229;
              case 0x1907:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R32G32B32_SINT;
              case 0x1908:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R32G32B32A32_SINT;
              default:
                switch(kVar1) {
                case 0x8d94:
                  goto switchD_001fd9fa_caseD_8229;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                case 0x8d98:
                  goto switchD_001fd9fa_caseD_8229;
                case 0x8d99:
                  goto switchD_001fd9fa_caseD_8229;
                default:
                  if ((((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) && (kVar1 != 0x84f9)) &&
                     ((kVar1 == 0x8228 || (kVar1 == 0x8227)))) {
                    return VK_FORMAT_R32G32_SINT;
                  }
                }
              }
              break;
            case 0x1405:
              switch(kVar1) {
              case 0x1901:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1902:
                return VK_FORMAT_X8_D24_UNORM_PACK32;
              case 0x1903:
                return VK_FORMAT_R32_UINT;
              case 0x1907:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R32G32B32_UINT;
              case 0x1908:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R32G32B32A32_UINT;
              default:
                switch(kVar1) {
                case 0x8d94:
                  return VK_FORMAT_R32_UINT;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                case 0x8d98:
                  goto switchD_001fd9fa_caseD_8229;
                case 0x8d99:
                  goto switchD_001fd9fa_caseD_8229;
                default:
                  if ((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) {
                    if (kVar1 == 0x84f9) {
                      return VK_FORMAT_D24_UNORM_S8_UINT;
                    }
                    if ((kVar1 == 0x8228) || (kVar1 == 0x8227)) {
                      return VK_FORMAT_R32G32_UINT;
                    }
                  }
                }
              }
              break;
            case 0x1406:
              switch(kVar1) {
              case 0x1901:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1902:
                return VK_FORMAT_D32_SFLOAT;
              case 0x1903:
                return VK_FORMAT_R32_SFLOAT;
              case 0x1907:
                return VK_FORMAT_R32G32B32_SFLOAT;
              case 0x1908:
                return VK_FORMAT_R32G32B32A32_SFLOAT;
              default:
                switch(kVar1) {
                case 0x8d94:
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d98:
                case 0x8d99:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                default:
                  if ((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) {
                    if (kVar1 == 0x84f9) {
                      return VK_FORMAT_D32_SFLOAT_S8_UINT;
                    }
                    if ((kVar1 != 0x8228) && (kVar1 == 0x8227)) {
                      return VK_FORMAT_R32G32_SFLOAT;
                    }
                  }
                }
              }
              break;
            case 0x1407:
            case 0x1408:
            case 0x1409:
            case 0x140c:
            case 0x140d:
              break;
            case 0x140a:
              VVar3 = VK_FORMAT_R64_SFLOAT;
              switch(kVar1) {
              case 0x1901:
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                goto switchD_001fd9fa_caseD_8229;
              case 0x1907:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R64G64B64_SFLOAT;
              case 0x1908:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R64G64B64A64_SFLOAT;
              default:
                switch(kVar1) {
                case 0x8d94:
                  goto switchD_001fd9fa_caseD_8229;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                case 0x8d98:
                  goto switchD_001fd9fa_caseD_8229;
                case 0x8d99:
                  goto switchD_001fd9fa_caseD_8229;
                default:
                  if ((((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) && (kVar1 != 0x84f9)) &&
                     ((kVar1 == 0x8228 || (kVar1 == 0x8227)))) {
                    return VK_FORMAT_R64G64_SFLOAT;
                  }
                }
              }
              break;
            case 0x140b:
LAB_001fe78f:
              switch(kVar1) {
              case 0x1901:
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                return VK_FORMAT_R16_SFLOAT;
              case 0x1907:
                return VK_FORMAT_R16G16B16_SFLOAT;
              case 0x1908:
                return VK_FORMAT_R16G16B16A16_SFLOAT;
              default:
                switch(kVar1) {
                case 0x8d94:
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d98:
                case 0x8d99:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                default:
                  if (((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) &&
                     ((kVar1 != 0x84f9 && ((kVar1 != 0x8228 && (kVar1 == 0x8227)))))) {
                    return VK_FORMAT_R16G16_SFLOAT;
                  }
                }
              }
              break;
            case 0x140e:
              VVar3 = VK_FORMAT_R64_SINT;
              switch(kVar1) {
              case 0x1901:
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                goto switchD_001fd9fa_caseD_8229;
              case 0x1907:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R64G64B64_SINT;
              case 0x1908:
switchD_001fd9fa_caseD_8229:
                return VK_FORMAT_R64G64B64A64_SINT;
              default:
                switch(kVar1) {
                case 0x8d94:
                  goto switchD_001fd9fa_caseD_8229;
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                case 0x8d98:
                  goto switchD_001fd9fa_caseD_8229;
                case 0x8d99:
                  goto switchD_001fd9fa_caseD_8229;
                default:
                  if ((((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) && (kVar1 != 0x84f9)) &&
                     ((kVar1 == 0x8228 || (kVar1 == 0x8227)))) {
                    return VK_FORMAT_R64G64_SINT;
                  }
                }
              }
              break;
            case 0x140f:
              switch(kVar1) {
              case 0x1901:
              case 0x1902:
              case 0x1904:
              case 0x1905:
              case 0x1906:
                break;
              case 0x1903:
                return VK_FORMAT_R64_UINT;
              case 0x1907:
                return VK_FORMAT_R64G64B64_UINT;
              case 0x1908:
                return VK_FORMAT_R64G64B64A64_UINT;
              default:
                switch(kVar1) {
                case 0x8d94:
                case 0x8d95:
                case 0x8d96:
                case 0x8d97:
                case 0x8d98:
                case 0x8d99:
                case 0x8d9a:
                case 0x8d9b:
                  break;
                default:
                  if (((kVar1 != 0x80e0) && (kVar1 != 0x80e1)) &&
                     ((kVar1 != 0x84f9 && ((kVar1 != 0x8228 && (kVar1 == 0x8227)))))) {
                    return VK_FORMAT_R64G64_UINT;
                  }
                }
              }
              break;
            default:
              switch(kVar2) {
              case 0x8362:
                if (kVar1 == 0x80e0) {
                  return VK_FORMAT_UNDEFINED;
                }
                if (kVar1 != 0x8d9a) {
                  __assert_fail("format == GL_BGR || format == GL_BGR_INTEGER",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                ,0x163,
                                "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
                }
                return VK_FORMAT_UNDEFINED;
              case 0x8363:
                if (kVar1 == 0x1907) {
                  return VK_FORMAT_R5G6B5_UNORM_PACK16;
                }
                if (kVar1 != 0x8d98) {
                  __assert_fail("format == GL_RGB || format == GL_RGB_INTEGER",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                ,0x166,
                                "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
                }
                return VK_FORMAT_R5G6B5_UNORM_PACK16;
              case 0x8364:
                if (kVar1 == 0x80e0) {
                  return VK_FORMAT_B5G6R5_UNORM_PACK16;
                }
                if (kVar1 != 0x8d9a) {
                  __assert_fail("format == GL_BGR || format == GL_BGR_INTEGER",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                ,0x169,
                                "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
                }
                return VK_FORMAT_B5G6R5_UNORM_PACK16;
              case 0x8365:
                if (kVar1 == 0x1907) {
                  return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
                }
                if (kVar1 == 0x80e1) {
                  return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
                }
                if (kVar1 == 0x8d98) {
                  return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
                }
                if (kVar1 != 0x8d9b) {
                  __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                ,0x16f,
                                "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
                }
                return VK_FORMAT_B4G4R4A4_UNORM_PACK16;
              case 0x8366:
                if (kVar1 == 0x1907) {
                  return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
                }
                if (kVar1 == 0x80e1) {
                  return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
                }
                if (kVar1 == 0x8d98) {
                  return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
                }
                if (kVar1 != 0x8d9b) {
                  __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                ,0x175,
                                "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
                }
                return VK_FORMAT_A1R5G5B5_UNORM_PACK16;
              case 0x8367:
                if ((((kVar1 != 0x1907) && (kVar1 != 0x80e1)) && (kVar1 != 0x8d98)) &&
                   (kVar1 != 0x8d9b)) {
                  __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                ,0x17b,
                                "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
                }
                VVar4 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_A8B8G8R8_UNORM_PACK32;
                VVar3 = VK_FORMAT_A8B8G8R8_UINT_PACK32;
                break;
              case 0x8368:
                if (((kVar1 != 0x1907) && (kVar1 != 0x80e1)) &&
                   ((kVar1 != 0x8d98 && (kVar1 != 0x8d9b)))) {
                  __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                ,0x181,
                                "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)");
                }
                VVar4 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_A2B10G10R10_UNORM_PACK32;
                VVar3 = VK_FORMAT_A2B10G10R10_UINT_PACK32;
                break;
              default:
                switch(kVar2) {
                case 0x8032:
                  if (kVar1 == 0x1907) {
                    return VK_FORMAT_UNDEFINED;
                  }
                  if (kVar1 != 0x8d98) {
                    __assert_fail("format == GL_RGB || format == GL_RGB_INTEGER",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                  ,0x160,
                                  "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                 );
                  }
                  return VK_FORMAT_UNDEFINED;
                case 0x8033:
                  if (kVar1 == 0x1907) {
                    return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
                  }
                  if (kVar1 == 0x80e1) {
                    return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
                  }
                  if (kVar1 == 0x8d98) {
                    return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
                  }
                  if (kVar1 != 0x8d9b) {
                    __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                  ,0x16c,
                                  "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                 );
                  }
                  return VK_FORMAT_R4G4B4A4_UNORM_PACK16;
                case 0x8034:
                  if (kVar1 == 0x1907) {
                    return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
                  }
                  if (kVar1 == 0x80e1) {
                    return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
                  }
                  if (kVar1 == 0x8d98) {
                    return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
                  }
                  if (kVar1 != 0x8d9b) {
                    __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                  ,0x172,
                                  "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                 );
                  }
                  return VK_FORMAT_R5G5B5A1_UNORM_PACK16;
                case 0x8035:
                  if (((kVar1 != 0x1907) && (kVar1 != 0x80e1)) &&
                     ((kVar1 != 0x8d98 && (kVar1 != 0x8d9b)))) {
                    __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                  ,0x178,
                                  "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                 );
                  }
                  VVar4 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_R8G8B8A8_UNORM;
                  VVar3 = VK_FORMAT_R8G8B8A8_UINT;
                  break;
                case 0x8036:
                  if ((((kVar1 != 0x1907) && (kVar1 != 0x80e1)) && (kVar1 != 0x8d98)) &&
                     (kVar1 != 0x8d9b)) {
                    __assert_fail("format == GL_RGB || format == GL_BGRA || format == GL_RGB_INTEGER || format == GL_BGRA_INTEGER"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                  ,0x17e,
                                  "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                 );
                  }
                  VVar4 = (uint)(kVar1 == 0x8d9b) * 4 + VK_FORMAT_A2R10G10B10_UNORM_PACK32;
                  VVar3 = VK_FORMAT_A2R10G10B10_UINT_PACK32;
                  break;
                default:
                  if (kVar2 == 0x84fa) {
                    if (kVar1 != 0x84f9) {
                      __assert_fail("format == GL_DEPTH_STENCIL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                    ,0x18a,
                                    "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                   );
                    }
                    return VK_FORMAT_D24_UNORM_S8_UINT;
                  }
                  if (kVar2 == 0x8c3b) {
                    if (kVar1 == 0x1907) {
                      return VK_FORMAT_B10G11R11_UFLOAT_PACK32;
                    }
                    if (kVar1 != 0x80e0) {
                      __assert_fail("format == GL_RGB || format == GL_BGR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                    ,0x184,
                                    "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                   );
                    }
                    return VK_FORMAT_B10G11R11_UFLOAT_PACK32;
                  }
                  if (kVar2 == 0x8c3e) {
                    if (kVar1 == 0x1907) {
                      return VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
                    }
                    if (kVar1 != 0x80e0) {
                      __assert_fail("format == GL_RGB || format == GL_BGR",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                    ,0x187,
                                    "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                   );
                    }
                    return VK_FORMAT_E5B9G9R9_UFLOAT_PACK32;
                  }
                  if (kVar2 == 0x8d61) goto LAB_001fe78f;
                  if (kVar2 == 0x8dad) {
                    if (kVar1 != 0x84f9) {
                      __assert_fail("format == GL_DEPTH_STENCIL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vk_format.h"
                                    ,0x18d,
                                    "VkFormat vkGetFormatFromOpenGLFormat(const GLenum, const GLenum)"
                                   );
                    }
                    return VK_FORMAT_D32_SFLOAT_S8_UINT;
                  }
                  goto switchD_001fe7b4_caseD_8d94;
                }
              }
              if (kVar1 != 0x8d98) {
                return VVar4;
              }
              return VVar3;
            }
switchD_001fe7b4_caseD_8d94:
            VVar3 = VK_FORMAT_UNDEFINED;
          }
        }
      }
    }
  }
switchD_001fd9fa_caseD_8229:
  return VVar3;
}

Assistant:

VkFormat
ktxTexture1_GetVkFormat(ktxTexture1* This)
{
    VkFormat vkFormat;

    vkFormat = vkGetFormatFromOpenGLInternalFormat(This->glInternalformat);
    if (vkFormat == VK_FORMAT_UNDEFINED) {
        vkFormat = vkGetFormatFromOpenGLFormat(This->glFormat,
            This->glType);
    }
    return vkFormat;
}